

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::PageHeader::PageHeader(PageHeader *this,PageHeader *other87)

{
  _DictionaryPageHeader__isset *p_Var1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  type tVar5;
  type tVar6;
  type tVar7;
  
  *(undefined ***)this = &PTR__PageHeader_024c04c8;
  DataPageHeader::DataPageHeader(&this->data_page_header);
  this->index_page_header = (IndexPageHeader)&PTR__IndexPageHeader_024c00b8;
  *(undefined ***)&this->dictionary_page_header = &PTR__DictionaryPageHeader_024c0120;
  (this->dictionary_page_header).num_values = 0;
  (this->dictionary_page_header).encoding = PLAIN;
  (this->dictionary_page_header).is_sorted = false;
  p_Var1 = &(this->dictionary_page_header).__isset;
  *p_Var1 = (_DictionaryPageHeader__isset)((byte)*p_Var1 & 0xfe);
  DataPageHeaderV2::DataPageHeaderV2(&this->data_page_header_v2);
  this->__isset = (_PageHeader__isset)((byte)this->__isset & 0xe0);
  iVar2 = other87->uncompressed_page_size;
  iVar3 = other87->compressed_page_size;
  iVar4 = other87->crc;
  this->type = other87->type;
  this->uncompressed_page_size = iVar2;
  this->compressed_page_size = iVar3;
  this->crc = iVar4;
  tVar5 = (other87->data_page_header).encoding;
  tVar6 = (other87->data_page_header).definition_level_encoding;
  tVar7 = (other87->data_page_header).repetition_level_encoding;
  (this->data_page_header).num_values = (other87->data_page_header).num_values;
  (this->data_page_header).encoding = tVar5;
  (this->data_page_header).definition_level_encoding = tVar6;
  (this->data_page_header).repetition_level_encoding = tVar7;
  Statistics::operator=
            (&(this->data_page_header).statistics,&(other87->data_page_header).statistics);
  (this->data_page_header).__isset = (other87->data_page_header).__isset;
  tVar5 = (other87->dictionary_page_header).encoding;
  (this->dictionary_page_header).num_values = (other87->dictionary_page_header).num_values;
  (this->dictionary_page_header).encoding = tVar5;
  (this->dictionary_page_header).is_sorted = (other87->dictionary_page_header).is_sorted;
  (this->dictionary_page_header).__isset = (other87->dictionary_page_header).__isset;
  DataPageHeaderV2::operator=(&this->data_page_header_v2,&other87->data_page_header_v2);
  this->__isset = other87->__isset;
  return;
}

Assistant:

PageHeader::PageHeader(const PageHeader& other87) {
  type = other87.type;
  uncompressed_page_size = other87.uncompressed_page_size;
  compressed_page_size = other87.compressed_page_size;
  crc = other87.crc;
  data_page_header = other87.data_page_header;
  index_page_header = other87.index_page_header;
  dictionary_page_header = other87.dictionary_page_header;
  data_page_header_v2 = other87.data_page_header_v2;
  __isset = other87.__isset;
}